

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O1

Location * __thiscall
trieste::Location::operator*(Location *__return_storage_ptr__,Location *this,Location *that)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  peVar1 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (that->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr) {
    uVar4 = that->pos;
    uVar6 = this->pos;
    uVar5 = uVar6;
    if (uVar4 < uVar6) {
      uVar5 = uVar4;
    }
    uVar6 = uVar6 + this->len;
    p_Var2 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    uVar4 = uVar4 + that->len;
    if (uVar4 < uVar6) {
      uVar4 = uVar6;
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
    if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __return_storage_ptr__->pos = uVar5;
      __return_storage_ptr__->len = uVar4 - uVar5;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
      __return_storage_ptr__->pos = uVar5;
      __return_storage_ptr__->len = uVar4 - uVar5;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
  }
  else {
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    p_Var2 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (__return_storage_ptr__->source).
    super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    sVar3 = this->len;
    __return_storage_ptr__->pos = this->pos;
    __return_storage_ptr__->len = sVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

Location operator*(const Location& that) const
    {
      if (source != that.source)
        return *this;

      auto lo = std::min(pos, that.pos);
      auto hi = std::max(pos + len, that.pos + that.len);
      return {source, lo, hi - lo};
    }